

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

time_double
time_function<int,libdivide::divider<int,(libdivide::Branching)0>>
          (random_numerators<int> *vals,divider<int,_(libdivide::Branching)0> denom,
          pFuncToTime<int,_libdivide::divider<int>_> timeFunc)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  undefined1 auVar3 [16];
  time_double tVar4;
  timer t;
  divider<int,_(libdivide::Branching)0> local_40;
  timeval local_38;
  timeval local_28;
  
  local_40.div.denom.magic = denom.div.denom.magic;
  local_40.div.denom.more = denom.div.denom.more;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  uVar2 = (*timeFunc)(vals,&local_40);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  auVar1 = vpsubq_avx((undefined1  [16])local_28,(undefined1  [16])local_38);
  auVar3 = vpmullq_avx512vl(auVar1,_DAT_00107010);
  auVar1 = vpshufd_avx(auVar3,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar3);
  tVar4.result = uVar2;
  tVar4.time = auVar1._0_8_;
  return tVar4;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}